

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_MappingRef::AddMappingChannel(ON_MappingRef *this,int mapping_channel_id,ON_UUID *mapping_id)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  ON_MappingChannel *pOVar5;
  long lVar6;
  ON_Xform *pOVar7;
  ON_Xform *pOVar8;
  byte bVar9;
  
  bVar9 = 0;
  iVar4 = (this->m_mapping_channels).m_count;
  if (0 < iVar4) {
    pOVar5 = (this->m_mapping_channels).m_a;
    do {
      if (pOVar5->m_mapping_channel_id == mapping_channel_id) {
        iVar4 = ON_UuidCompare(mapping_id,&pOVar5->m_mapping_id);
        return iVar4 == 0;
      }
      pOVar5 = pOVar5 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  pOVar5 = ON_SimpleArray<ON_MappingChannel>::AppendNew(&this->m_mapping_channels);
  pOVar5->m_mapping_channel_id = mapping_channel_id;
  uVar2 = mapping_id->Data2;
  uVar3 = mapping_id->Data3;
  uVar1 = *(undefined8 *)mapping_id->Data4;
  (pOVar5->m_mapping_id).Data1 = mapping_id->Data1;
  (pOVar5->m_mapping_id).Data2 = uVar2;
  (pOVar5->m_mapping_id).Data3 = uVar3;
  *(undefined8 *)(pOVar5->m_mapping_id).Data4 = uVar1;
  pOVar5->m_mapping_index = -1;
  pOVar7 = &ON_Xform::IdentityTransformation;
  pOVar8 = &pOVar5->m_object_xform;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pOVar8->m_xform[0][0] = pOVar7->m_xform[0][0];
    pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pOVar8 = (ON_Xform *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  return true;
}

Assistant:

bool ON_MappingRef::AddMappingChannel(
        int mapping_channel_id,
        const ON_UUID& mapping_id
        )
{
  int i;
  if ( (i = m_mapping_channels.Count()) > 0 )
  {
    for ( const ON_MappingChannel* mc = m_mapping_channels.Array(); i--; mc++ )
    {
      if ( mapping_channel_id == mc->m_mapping_channel_id )
      {
        // a matching mapping channel id exists
        // return true if mapping_id matches
        return ( 0 == ON_UuidCompare(&mapping_id,&mc->m_mapping_id) );
      }
    }
  }

  ON_MappingChannel& mc   = m_mapping_channels.AppendNew();
  mc.m_mapping_channel_id = mapping_channel_id;
  mc.m_mapping_id         = mapping_id;
  mc.m_mapping_index      = -1; // 27th October 2011 John Croudy - constructor is not called by AppendNew().
  mc.m_object_xform = ON_Xform::IdentityTransformation;

  return true;
}